

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O2

void __thiscall hmi::renderer::~renderer(renderer *this)

{
  if (this->m_program != 0) {
    (*glad_glDeleteProgram)(this->m_program);
  }
  if (this->m_context != (void *)0x0) {
    SDL_GL_DeleteContext();
  }
  return;
}

Assistant:

renderer::~renderer() {
    // delete shader

    if (m_program != 0) {
      glDeleteProgram(m_program);
    }

    // delete context

    if (m_context != nullptr) {
      SDL_GL_DeleteContext(m_context);
    }
  }